

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_Char FT_Stream_ReadChar(FT_Stream stream,FT_Error *error)

{
  ulong uVar1;
  ulong in_RAX;
  unsigned_long uVar2;
  FT_Byte result;
  undefined8 uStack_18;
  
  uStack_18 = in_RAX & 0xffffffffffffff;
  *error = 0;
  uVar1 = stream->pos;
  if (stream->read == (FT_Stream_IoFunc)0x0) {
    if (uVar1 < stream->size) {
      uStack_18 = (ulong)stream->base[uVar1] << 0x38;
      goto LAB_001385ad;
    }
  }
  else {
    uVar2 = (*stream->read)(stream,uVar1,(uchar *)((long)&uStack_18 + 7),1);
    if (uVar2 == 1) {
LAB_001385ad:
      stream->pos = stream->pos + 1;
      return uStack_18._7_1_;
    }
  }
  *error = 0x55;
  return '\0';
}

Assistant:

FT_BASE_DEF( FT_Char )
  FT_Stream_ReadChar( FT_Stream  stream,
                      FT_Error*  error )
  {
    FT_Byte  result = 0;


    FT_ASSERT( stream );

    *error = FT_Err_Ok;

    if ( stream->read )
    {
      if ( stream->read( stream, stream->pos, &result, 1L ) != 1L )
        goto Fail;
    }
    else
    {
      if ( stream->pos < stream->size )
        result = stream->base[stream->pos];
      else
        goto Fail;
    }
    stream->pos++;

    return (FT_Char)result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadChar:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return 0;
  }